

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O1

void __thiscall GusteauChapter3UI::Run(GusteauChapter3UI *this,ApplicationContextBase *ac)

{
  Blackboard *b;
  bool bVar1;
  int id;
  TypedData *d;
  long lVar2;
  long lVar3;
  double dVar4;
  char buff_1 [256];
  ImVec2 local_128 [32];
  
  ImGui::Text("Hello Chapter 3");
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("Quit",local_128);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "quit",0);
  }
  ImGui::InputText("###value",Run::buff,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("Push",local_128);
  if (bVar1) {
    dVar4 = atof(Run::buff);
    b = (Blackboard *)
        ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
        super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    d = (TypedData *)operator_new(0x18);
    (d->type)._M_target = (type_info *)&float::typeinfo;
    d->_vptr_TypedData = (_func_int **)&PTR__TypedData_001e4830;
    *(float *)&d[1]._vptr_TypedData = (float)dVar4;
    id = blackboard_new_entry(b,d);
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "push_value",id);
  }
  ImGui::SameLine(0.0,-1.0);
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("Pop",local_128);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "pop_value",0);
  }
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("+",local_128);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "add",0);
  }
  ImGui::SameLine(0.0,-1.0);
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("-",local_128);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "subtract",0);
  }
  ImGui::SameLine(0.0,-1.0);
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("*",local_128);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "multiply",0);
  }
  ImGui::SameLine(0.0,-1.0);
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("/",local_128);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "divide",0);
  }
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("Undo",local_128);
  if (bVar1) {
    Journal::undo((Journal *)&ac[2].join_now);
  }
  ImGui::SameLine(0.0,-1.0);
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  bVar1 = ImGui::Button("Redo",local_128);
  if (bVar1) {
    Journal::redo((Journal *)&ac[2].join_now);
  }
  ImGui::TextUnformatted("------ STACK ------",(char *)0x0);
  lVar2 = (long)ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          - (long)ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 2;
    lVar3 = 0;
    do {
      sprintf((char *)local_128,"%f",
              (double)*(float *)((long)&(ac[1].ui.
                                         super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr)->_vptr_UIContext + lVar3 * 4));
      ImGui::TextUnformatted((char *)local_128,(char *)0x0);
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return;
}

Assistant:

virtual void Run(ApplicationContextBase& ac) override
    {
        auto app = reinterpret_cast<ApplicationContext*>(&ac);

        ImGui::Text("Hello Chapter 3");
        if (ImGui::Button("Quit"))
        {
            csp_emit(app->csp, "quit", 0);
        }


        static char buff[256];
        ImGui::InputText("###value", buff, sizeof(buff));
        if (ImGui::Button("Push"))
        {
            float v = static_cast<float>(atof(buff));
            int id = blackboard_new_entry(app->blackboard, new Data<float>(v));
            csp_emit(app->csp, "push_value", id);
        }
        ImGui::SameLine();
        if (ImGui::Button("Pop"))
            csp_emit(app->csp, "pop_value", 0);

        if (ImGui::Button("+"))
            csp_emit(app->csp, "add", 0);
        ImGui::SameLine();
        if (ImGui::Button("-"))
            csp_emit(app->csp, "subtract", 0);
        ImGui::SameLine();
        if (ImGui::Button("*"))
            csp_emit(app->csp, "multiply", 0);
        ImGui::SameLine();
        if (ImGui::Button("/"))
            csp_emit(app->csp, "divide", 0);

        if (ImGui::Button("Undo"))
        {
            app->journal.undo();
        }
        ImGui::SameLine();
        if (ImGui::Button("Redo"))
        {
            app->journal.redo();
        }

        ImGui::TextUnformatted("------ STACK ------");
        size_t sz = app->value_stack.size();
        for (auto i = 0; i < sz; ++i)
        {
            char buff[256];
            sprintf(buff, "%f", app->value_stack[i]);
            ImGui::TextUnformatted(buff);
        }
    }